

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O2

void Cmd_End(Abc_Frame_t *pAbc)

{
  Vec_Ptr_t *p;
  int iVar1;
  st__generator *psVar2;
  void *__ptr;
  int i;
  char *pValue;
  char *pKey;
  Abc_Command *local_38;
  char *local_30;
  
  Cmd_HistoryWrite(pAbc,1000000000);
  psVar2 = st__init_gen(pAbc->tCommands);
  while( true ) {
    iVar1 = st__gen(psVar2,&local_30,(char **)&local_38);
    if (iVar1 == 0) break;
    CmdCommandFree(local_38);
  }
  st__free_gen(psVar2);
  st__free_table(pAbc->tCommands);
  psVar2 = st__init_gen(pAbc->tAliases);
  while( true ) {
    iVar1 = st__gen(psVar2,&local_30,(char **)&local_38);
    if (iVar1 == 0) break;
    CmdCommandAliasFree((Abc_Alias *)local_38);
  }
  st__free_gen(psVar2);
  st__free_table(pAbc->tAliases);
  psVar2 = st__init_gen(pAbc->tFlags);
  while( true ) {
    iVar1 = st__gen(psVar2,&local_30,(char **)&local_38);
    if (iVar1 == 0) break;
    if (local_30 != (char *)0x0) {
      free(local_30);
      local_30 = (char *)0x0;
    }
    if (local_38 != (Abc_Command *)0x0) {
      free(local_38);
      local_38 = (Abc_Command *)0x0;
    }
  }
  st__free_gen(psVar2);
  st__free_table(pAbc->tFlags);
  p = pAbc->aHistory;
  if (p != (Vec_Ptr_t *)0x0) {
    for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
      __ptr = Vec_PtrEntry(p,iVar1);
      if ((void *)0x2 < __ptr) {
        free(__ptr);
      }
    }
    free(p->pArray);
    free(p);
  }
  return;
}

Assistant:

void Cmd_End( Abc_Frame_t * pAbc )
{
    st__generator * gen;
    char * pKey, * pValue;
    Cmd_HistoryWrite( pAbc, ABC_INFINITY );

//    st__free_table( pAbc->tCommands, (void (*)()) 0, CmdCommandFree );
//    st__free_table( pAbc->tAliases,  (void (*)()) 0, CmdCommandAliasFree );
//    st__free_table( pAbc->tFlags,    free, free );

    st__foreach_item( pAbc->tCommands, gen, (const char **)&pKey, (char **)&pValue )
        CmdCommandFree( (Abc_Command *)pValue );
    st__free_table( pAbc->tCommands );

    st__foreach_item( pAbc->tAliases, gen, (const char **)&pKey, (char **)&pValue )
        CmdCommandAliasFree( (Abc_Alias *)pValue );
    st__free_table( pAbc->tAliases );

    st__foreach_item( pAbc->tFlags, gen, (const char **)&pKey, (char **)&pValue )
        ABC_FREE( pKey ), ABC_FREE( pValue );
    st__free_table( pAbc->tFlags );

    Vec_PtrFreeFree( pAbc->aHistory );
}